

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_mod_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t dofs;
  ulong uVar6;
  int i;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint32_t oprsz;
  uint uVar11;
  
  pTVar1 = s->uc->tcg_ctx;
  uVar4 = insn >> 0xc;
  if ((((insn >> 0xb & 1) != 0) || ((insn & 0x60000000) == 0x20000000 && (uVar4 & 0xf) == 0xf)) &&
     (((insn >> 0xb & 1) == 0 ||
      (((uVar4 & 0xf) != 0xf || (((uint)s->isar->id_aa64pfr0 & 0xf0000) != 0x10000)))))) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  uVar11 = insn >> 0xd & 7;
  uVar9 = insn >> 5 & 0x1f;
  uVar2 = insn >> 0xb;
  uVar7 = uVar2 & 0xe0;
  uVar10 = uVar9 | uVar7;
  switch(uVar11) {
  default:
    uVar5 = (ulong)uVar10 << (char)uVar11 * '\b';
    break;
  case 4:
  case 5:
    uVar6 = (ulong)uVar10 << ((byte)((insn >> 0xd) << 3) & 8);
    uVar6 = uVar6 << 0x10 | uVar6;
    uVar5 = uVar6 << 0x20;
LAB_006aa931:
    uVar5 = uVar5 | uVar6;
    goto LAB_006aaa00;
  case 6:
    uVar5 = (ulong)(uVar10 << 8) | 0xff;
    if ((uVar4 & 1) != 0) {
      uVar5 = (ulong)(uVar10 << 0x10) | 0xffff;
    }
    break;
  case 7:
    if ((uVar4 & 1) == 0 && (insn & 0x20000000) == 0) {
      uVar10 = uVar10 << 8 | uVar10;
      uVar5 = (ulong)uVar10;
      uVar6 = (ulong)(uVar10 << 0x10);
    }
    else {
      if ((insn >> 0x1d & 1) != 0 && (uVar4 & 1) == 0) {
        bVar3 = 0;
        lVar8 = 0;
        uVar5 = 0;
        do {
          uVar6 = 0;
          if (((uint)(1L << ((byte)lVar8 & 0x3f)) & uVar10) != 0) {
            uVar6 = 0xffL << (bVar3 & 0x3f);
          }
          uVar5 = uVar5 | uVar6;
          lVar8 = lVar8 + 1;
          bVar3 = bVar3 + 8;
        } while (lVar8 != 8);
        goto LAB_006aaa00;
      }
      if ((uVar4 & 1) == 0) {
        uVar5 = 0;
        goto LAB_006aaa00;
      }
      if ((insn >> 0x1d & 1) != 0) {
        uVar6 = (ulong)(uVar9 | uVar2 & 0x20) << 0x30;
        uVar5 = uVar6 | 0x8000000000000000;
        if (uVar7 < 0x80) {
          uVar5 = uVar6;
        }
        if ((uVar2 & 0x40) == 0) {
          uVar5 = uVar5 | 0x4000000000000000;
          goto LAB_006aaa00;
        }
        uVar6 = 0x3fc0000000000000;
        goto LAB_006aa931;
      }
      if ((insn >> 0xb & 1) == 0) {
        uVar6 = (ulong)((uVar9 | uVar2 & 0x20) << 0x13);
        uVar5 = uVar6 | 0x80000000;
        if (uVar7 < 0x80) {
          uVar5 = uVar6;
        }
        uVar5 = (uint)((uVar2 & 0x40) == 0) << 0x19 | uVar5;
        uVar5 = (uVar5 << 0x20 | uVar5) + 0x3e0000003e000000;
        goto LAB_006aaa00;
      }
      uVar5 = vfp_expand_imm_aarch64(1,(uint8_t)uVar10);
      uVar6 = uVar5 << 0x10;
    }
    uVar5 = (uVar6 | uVar5) << 0x20 | uVar6 | uVar5;
    goto LAB_006aaa00;
  }
  uVar5 = uVar5 << 0x20 | uVar5;
LAB_006aaa00:
  uVar5 = -(ulong)(uVar11 != 7 & (byte)(insn >> 0x1d) & 1) ^ uVar5;
  dofs = (insn & 0x1f) * 0x100 + 0xc10;
  if ((insn & 0xd000) != 0x9000 && (insn & 0x9000) != 0x1000) {
    tcg_gen_gvec_dup64i_aarch64(pTVar1,dofs,(insn >> 0x1b & 8) + 8,s->sve_len,uVar5);
    return;
  }
  oprsz = (insn >> 0x1b & 8) + 8;
  pTVar1 = s->uc->tcg_ctx;
  if ((insn >> 0x1d & 1) == 0) {
    tcg_gen_gvec_ori_aarch64(pTVar1,3,dofs,dofs,uVar5,oprsz,s->sve_len);
  }
  else {
    tcg_gen_gvec_andi_aarch64(pTVar1,3,dofs,dofs,uVar5,oprsz,s->sve_len);
  }
  return;
}

Assistant:

static void disas_simd_mod_imm(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int cmode = extract32(insn, 12, 4);
    int cmode_3_1 = extract32(cmode, 1, 3);
    int cmode_0 = extract32(cmode, 0, 1);
    int o2 = extract32(insn, 11, 1);
    uint64_t abcdefgh = extract32(insn, 5, 5) | (extract32(insn, 16, 3) << 5);
    bool is_neg = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);
    uint64_t imm = 0;

    if (o2 != 0 || ((cmode == 0xf) && is_neg && !is_q)) {
        /* Check for FMOV (vector, immediate) - half-precision */
        if (!(dc_isar_feature(aa64_fp16, s) && o2 && cmode == 0xf)) {
            unallocated_encoding(s);
            return;
        }
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* See AdvSIMDExpandImm() in ARM ARM */
    switch (cmode_3_1) {
    case 0: /* Replicate(Zeros(24):imm8, 2) */
    case 1: /* Replicate(Zeros(16):imm8:Zeros(8), 2) */
    case 2: /* Replicate(Zeros(8):imm8:Zeros(16), 2) */
    case 3: /* Replicate(imm8:Zeros(24), 2) */
    {
        int shift = cmode_3_1 * 8;
        imm = bitfield_replicate(abcdefgh << shift, 32);
        break;
    }
    case 4: /* Replicate(Zeros(8):imm8, 4) */
    case 5: /* Replicate(imm8:Zeros(8), 4) */
    {
        int shift = (cmode_3_1 & 0x1) * 8;
        imm = bitfield_replicate(abcdefgh << shift, 16);
        break;
    }
    case 6:
        if (cmode_0) {
            /* Replicate(Zeros(8):imm8:Ones(16), 2) */
            imm = (abcdefgh << 16) | 0xffff;
        } else {
            /* Replicate(Zeros(16):imm8:Ones(8), 2) */
            imm = (abcdefgh << 8) | 0xff;
        }
        imm = bitfield_replicate(imm, 32);
        break;
    case 7:
        if (!cmode_0 && !is_neg) {
            imm = bitfield_replicate(abcdefgh, 8);
        } else if (!cmode_0 && is_neg) {
            int i;
            imm = 0;
            for (i = 0; i < 8; i++) {
                if ((abcdefgh) & (1ULL << i)) {
                    imm |= 0xffULL << (i * 8);
                }
            }
        } else if (cmode_0) {
            if (is_neg) {
                imm = (abcdefgh & 0x3f) << 48;
                if (abcdefgh & 0x80) {
                    imm |= 0x8000000000000000ULL;
                }
                if (abcdefgh & 0x40) {
                    imm |= 0x3fc0000000000000ULL;
                } else {
                    imm |= 0x4000000000000000ULL;
                }
            } else {
                if (o2) {
                    /* FMOV (vector, immediate) - half-precision */
                    imm = vfp_expand_imm(MO_16, abcdefgh);
                    /* now duplicate across the lanes */
                    imm = bitfield_replicate(imm, 16);
                } else {
                    imm = (abcdefgh & 0x3f) << 19;
                    if (abcdefgh & 0x80) {
                        imm |= 0x80000000;
                    }
                    if (abcdefgh & 0x40) {
                        imm |= 0x3e000000;
                    } else {
                        imm |= 0x40000000;
                    }
                    imm |= (imm << 32);
                }
            }
        }
        break;
    default:
        fprintf(stderr, "%s: cmode_3_1: %x\n", __func__, cmode_3_1);
        g_assert_not_reached();
    }

    if (cmode_3_1 != 7 && is_neg) {
        imm = ~imm;
    }

    if (!((cmode & 0x9) == 0x1 || (cmode & 0xd) == 0x9)) {
        /* MOVI or MVNI, with MVNI negation handled above.  */
        tcg_gen_gvec_dup64i(tcg_ctx, vec_full_reg_offset(s, rd), is_q ? 16 : 8,
                            vec_full_reg_size(s), imm);
    } else {
        /* ORR or BIC, with BIC negation to AND handled above.  */
        if (is_neg) {
            gen_gvec_fn2i(s, is_q, rd, rd, imm, tcg_gen_gvec_andi, MO_64);
        } else {
            gen_gvec_fn2i(s, is_q, rd, rd, imm, tcg_gen_gvec_ori, MO_64);
        }
    }
}